

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall crypto_tests::chacha20_midblock::test_method(chacha20_midblock *this)

{
  long lVar1;
  long lVar2;
  ChaCha20 *pCVar3;
  ChaCha20 *pCVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  byte bVar7;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  Span<const_std::byte> key_00;
  Span<std::byte> out;
  Span<const_std::byte> key_01;
  Span<std::byte> out_00;
  Span<std::byte> out_01;
  Span<std::byte> out_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  check_type cVar8;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  byte *local_228;
  undefined8 local_220;
  assertion_result local_218;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  byte b2 [7];
  byte b1 [5];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0;
  char **local_1b8;
  byte b3 [52];
  byte block [64];
  ChaCha20 c20;
  array<std::byte,_32UL> key;
  
  bVar7 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key._M_elems[0x10] = 0;
  key._M_elems[0x11] = 0;
  key._M_elems[0x12] = 0;
  key._M_elems[0x13] = 0;
  key._M_elems[0x14] = 0;
  key._M_elems[0x15] = 0;
  key._M_elems[0x16] = 0;
  key._M_elems[0x17] = 0;
  key._M_elems[0x18] = 0;
  key._M_elems[0x19] = 0;
  key._M_elems[0x1a] = 0;
  key._M_elems[0x1b] = 0;
  key._M_elems[0x1c] = 0;
  key._M_elems[0x1d] = 0;
  key._M_elems[0x1e] = 0;
  key._M_elems[0x1f] = 0;
  key._M_elems[0] = 0;
  key._M_elems[1] = 0;
  key._M_elems[2] = 0;
  key._M_elems[3] = 0;
  key._M_elems[4] = 0;
  key._M_elems[5] = 0;
  key._M_elems[6] = 0;
  key._M_elems[7] = 0;
  key._M_elems[8] = 0;
  key._M_elems[9] = 0;
  key._M_elems[10] = 0;
  key._M_elems[0xb] = 0;
  key._M_elems[0xc] = 0;
  key._M_elems[0xd] = 0;
  key._M_elems[0xe] = 0;
  key._M_elems[0xf] = 0;
  key_00.m_size = 0x20;
  key_00.m_data = key._M_elems;
  ChaCha20::ChaCha20(&c20,key_00);
  out.m_size = 0x40;
  out.m_data = block;
  ChaCha20::Keystream(&c20,out);
  key_01.m_size = 0x20;
  key_01.m_data = key._M_elems;
  ChaCha20::ChaCha20((ChaCha20 *)local_1d0,key_01);
  pCVar3 = (ChaCha20 *)local_1d0;
  pCVar4 = &c20;
  for (lVar2 = 0x1d; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pCVar4->m_aligned).input[0] = (pCVar3->m_aligned).input[0];
    pCVar3 = (ChaCha20 *)((long)pCVar3 + (ulong)bVar7 * -8 + 4);
    pCVar4 = (ChaCha20 *)((long)pCVar4 + (ulong)bVar7 * -8 + 4);
  }
  ChaCha20::~ChaCha20((ChaCha20 *)local_1d0);
  out_00.m_size = 5;
  out_00.m_data = b1;
  ChaCha20::Keystream(&c20,out_00);
  out_01.m_size = 7;
  out_01.m_data = b2;
  ChaCha20::Keystream(&c20,out_01);
  out_02.m_size = 0x34;
  out_02.m_data = b3;
  ChaCha20::Keystream(&c20,out_02);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x34e;
  file.m_begin = (iterator)&local_1f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_200,msg);
  local_220 = 5;
  local_228 = block;
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::ranges::__equal_fn::
       operator()<Span<std::byte>,_std::byte_(&)[5],_std::ranges::equal_to,_std::identity,_std::identity>
                 ((__equal_fn *)&std::ranges::equal,&local_228,b1);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_238 = "std::ranges::equal(Span{block}.first(5), b1)";
  local_230 = "";
  local_1d0[8] = false;
  local_1d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_240 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_1b8 = &local_238;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)local_1d0,1,0,WARN,_cVar8,(size_t)&local_248,0x34e);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x34f;
  file_00.m_begin = (iterator)&local_258;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_268,
             msg_00);
  local_228 = block + 5;
  local_220 = 7;
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::ranges::__equal_fn::
       operator()<Span<std::byte>,_std::byte_(&)[7],_std::ranges::equal_to,_std::identity,_std::identity>
                 ((__equal_fn *)&std::ranges::equal,&local_228,b2);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_238 = "std::ranges::equal(Span{block}.subspan(5, 7), b2)";
  local_230 = "";
  local_1d0[8] = false;
  local_1d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_270 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_1b8 = &local_238;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)local_1d0,1,0,WARN,_cVar8,(size_t)&local_278,0x34f);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x350;
  file_01.m_begin = (iterator)&local_288;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_298,
             msg_01);
  local_228 = block + 0xc;
  local_220 = 0x34;
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::ranges::__equal_fn::
       operator()<Span<std::byte>,_std::byte_(&)[52],_std::ranges::equal_to,_std::identity,_std::identity>
                 ((__equal_fn *)&std::ranges::equal,&local_228,b3);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_238 = "std::ranges::equal(Span{block}.last(52), b3)";
  local_230 = "";
  local_1d0[8] = false;
  local_1d0._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_2a0 = "";
  local_1b8 = &local_238;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)local_1d0,1,0,WARN,_cVar8,(size_t)&local_2a8,0x350);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  ChaCha20::~ChaCha20(&c20);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(chacha20_midblock)
{
    auto key = "0000000000000000000000000000000000000000000000000000000000000000"_hex;
    ChaCha20 c20{key};
    // get one block of keystream
    std::byte block[64];
    c20.Keystream(block);
    std::byte b1[5], b2[7], b3[52];
    c20 = ChaCha20{key};
    c20.Keystream(b1);
    c20.Keystream(b2);
    c20.Keystream(b3);

    BOOST_CHECK(std::ranges::equal(Span{block}.first(5), b1));
    BOOST_CHECK(std::ranges::equal(Span{block}.subspan(5, 7), b2));
    BOOST_CHECK(std::ranges::equal(Span{block}.last(52), b3));
}